

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O2

int lj_lib_postreg(lua_State *L,lua_CFunction cf,int id,char *name)

{
  GCtab *t;
  uint64_t uVar1;
  GCfunc *pGVar2;
  size_t lenx;
  GCstr *key;
  TValue *pTVar3;
  GCobj *o;
  
  pGVar2 = lj_lib_pushcc(L,cf,id,0);
  t = *(GCtab **)((L->base[-2].u64 & 0x7fffffffffff) + 0x10);
  lenx = strlen(name);
  key = lj_str_new(L,name,lenx);
  pTVar3 = lj_tab_setstr(L,t,key);
  pTVar3->u64 = (ulong)pGVar2 | 0xfffb800000000000;
  if ((t->marked & 4) != 0) {
    uVar1 = (L->glref).ptr64;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr64 = *(uint64_t *)(uVar1 + 0x40);
    *(GCtab **)(uVar1 + 0x40) = t;
  }
  pTVar3 = L->top;
  L->top = pTVar3 + 1;
  pTVar3->u64 = (ulong)pGVar2 | 0xfffb800000000000;
  return 1;
}

Assistant:

int lj_lib_postreg(lua_State *L, lua_CFunction cf, int id, const char *name)
{
  GCfunc *fn = lj_lib_pushcf(L, cf, id);
  GCtab *t = tabref(curr_func(L)->c.env);  /* Reference to parent table. */
  setfuncV(L, lj_tab_setstr(L, t, lj_str_newz(L, name)), fn);
  lj_gc_anybarriert(L, t);
  setfuncV(L, L->top++, fn);
  return 1;
}